

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

void __thiscall Population::Population(Population *this,World *w,size_t creatno,size_t els)

{
  iterator __position;
  Creature *this_00;
  undefined1 local_50 [8];
  shared_ptr<Creature> nc;
  
  this->_vptr_Population = (_func_int **)&PTR__Population_0011d648;
  this->ELITE_SIZE = els;
  this->world = w;
  (this->creats).
  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->creats).
  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->creats).
  super__Vector_base<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (creatno != 0) {
    do {
      this_00 = (Creature *)operator_new(0x50);
      Creature::Creature(this_00,this,1);
      boost::shared_ptr<Creature>::shared_ptr<Creature>((shared_ptr<Creature> *)local_50,this_00);
      std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::
      push_back(&this->creats,(shared_ptr<Creature> *)local_50);
      if (local_50 == (undefined1  [8])0x0) {
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Creature>::operator->() const [T = Creature]"
                     );
      }
      nc.pn.pi_ = *(sp_counted_base **)((long)local_50 + 0x30);
      __position._M_current =
           (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->fitdict,__position,(double *)&nc.pn);
      }
      else {
        *__position._M_current = (double)nc.pn.pi_;
        (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      boost::detail::shared_count::~shared_count((shared_count *)&nc);
      creatno = creatno - 1;
    } while (creatno != 0);
  }
  return;
}

Assistant:

Population::Population( World * w, size_t creatno, size_t els ) :
	ELITE_SIZE(els), world(w)
{
	for(size_t i = 0; i < creatno; ++i)
	{
		boost::shared_ptr<Creature> nc(new Creature(this));
		creats.push_back(nc);
		fitdict.push_back(nc->get_fitness());

	}
}